

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

void __thiscall SceneParser::parsePerspectiveCamera(SceneParser *this)

{
  PerspectiveCamera *this_00;
  float fVar1;
  Vector3f up;
  Vector3f direction;
  Vector3f center;
  char token [100];
  undefined1 local_9c [12];
  undefined1 local_90 [12];
  short local_78;
  char cStack_76;
  undefined1 uStack_75;
  short sStack_74;
  undefined1 uStack_72;
  undefined1 uStack_71;
  short local_70;
  
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x77,"void SceneParser::parsePerspectiveCamera()");
  }
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (CONCAT13(uStack_72,CONCAT21(sStack_74,uStack_75)) != 0x726574 ||
      CONCAT13(uStack_75,CONCAT12(cStack_76,local_78)) != 0x746e6563) {
    __assert_fail("!strcmp(token, \"center\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x79,"void SceneParser::parsePerspectiveCamera()");
  }
  readVector3f((SceneParser *)&stack0xffffffffffffff7c);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_70 != 0x6e ||
      CONCAT17(uStack_71,
               CONCAT16(uStack_72,
                        CONCAT24(sStack_74,CONCAT13(uStack_75,CONCAT12(cStack_76,local_78))))) !=
      0x6f69746365726964) {
    __assert_fail("!strcmp(token, \"direction\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x7c,"void SceneParser::parsePerspectiveCamera()");
  }
  readVector3f((SceneParser *)local_90);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (cStack_76 == '\0' && local_78 == 0x7075) {
    readVector3f((SceneParser *)local_9c);
    getToken(this,(char *)&stack0xffffffffffffff88);
    if (sStack_74 != 0x65 || CONCAT13(uStack_75,CONCAT12(cStack_76,local_78)) != 0x6c676e61) {
      __assert_fail("!strcmp(token, \"angle\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                    ,0x82,"void SceneParser::parsePerspectiveCamera()");
    }
    fVar1 = readFloat(this);
    getToken(this,(char *)&stack0xffffffffffffff88);
    if (local_78 == 0x7d) {
      this_00 = (PerspectiveCamera *)operator_new(0x40);
      PerspectiveCamera::PerspectiveCamera
                (this_00,(Vector3f *)&stack0xffffffffffffff7c,(Vector3f *)local_90,
                 (Vector3f *)local_9c,(fVar1 * 3.1415927) / 180.0);
      this->_camera = (Camera *)this_00;
      return;
    }
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x86,"void SceneParser::parsePerspectiveCamera()");
  }
  __assert_fail("!strcmp(token, \"up\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x7f,"void SceneParser::parsePerspectiveCamera()");
}

Assistant:

void
SceneParser::parsePerspectiveCamera() {
    // Read in the camera parameters.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "center"));
    Vector3f center = readVector3f();
    getToken(token);
    assert(!strcmp(token, "direction"));
    Vector3f direction = readVector3f();
    getToken(token);
    assert(!strcmp(token, "up"));
    Vector3f up = readVector3f();
    getToken(token);
    assert(!strcmp(token, "angle"));
    float angle_degrees = readFloat();
    float angle_radians = (float) DegreesToRadians(angle_degrees);
    getToken(token);
    assert(!strcmp(token, "}"));
    _camera = new PerspectiveCamera(center, direction, up, angle_radians);
}